

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteObservations::MADPComponentDiscreteObservations
          (MADPComponentDiscreteObservations *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__MADPComponentDiscreteObservations_00d3faa8;
  std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::vector
            ((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_> *)
             0xad19fa);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xad1a08);
  std::
  vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ::vector((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
            *)0xad1a16);
  *(undefined1 *)(in_RDI + 1) = 0;
  in_RDI[3] = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  in_RDI[7] = 0;
  *(undefined1 *)((long)in_RDI + 10) = 1;
  in_RDI[2] = 0;
  return;
}

Assistant:

MADPComponentDiscreteObservations::MADPComponentDiscreteObservations()
{
    _m_initialized = false;
    _m_observationStepSize = 0;
    _m_cachedAllJointObservations=false;
    _m_jointObservationIndices=0;
    _m_jointIndicesValid=true;
    _m_nrJointObservations=0;
}